

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Curiosity.cpp
# Opt level: O3

void __thiscall
chrono::curiosity::CuriosityPart::Initialize
          (CuriosityPart *this,shared_ptr<chrono::ChBodyAuxRef> *chassis)

{
  ChFrameMoving<double> *Fa;
  ChFrame<double> X_GC;
  ChFrame<double> CStack_98;
  
  Construct(this,*(ChSystem **)
                  ((chassis->super___shared_ptr<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2>).
                   _M_ptr + 0x38));
  Fa = (ChFrameMoving<double> *)
       (**(code **)(*(long *)(chassis->
                             super___shared_ptr<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2>).
                             _M_ptr + 0x1f0))();
  operator*(&CStack_98,Fa,&this->m_pos);
  chrono::ChBodyAuxRef::SetFrame_REF_to_abs
            ((ChFrame *)
             (this->m_body).super___shared_ptr<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr);
  return;
}

Assistant:

void CuriosityPart::Initialize(std::shared_ptr<ChBodyAuxRef> chassis) {
    Construct(chassis->GetSystem());

    // Set absolute position
    ChFrame<> X_GC = chassis->GetFrame_REF_to_abs() * m_pos;
    m_body->SetFrame_REF_to_abs(X_GC);
}